

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

void Acb_NtkResetNode(Acb_Ntk_t *p,int Pivot,word uTruth,Vec_Int_t *vSupp)

{
  int Pivot_00;
  int *piVar1;
  int *piVar2;
  long lVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  word *pwVar5;
  long lVar6;
  Vec_Int_t *pVVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  int *piVar14;
  long lVar15;
  bool bVar16;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(0x40);
  p_00->pArray = piVar4;
  if (Pivot < 1) {
LAB_003b2f9b:
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                  ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
  }
  if ((p->vObjType).nSize <= Pivot) {
LAB_003b2fba:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  if (0xfd < (byte)((p->vObjType).pArray[(uint)Pivot] - 5U)) {
    __assert_fail("!Acb_ObjIsCio(p, Pivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                  ,0x28a,"void Acb_NtkResetNode(Acb_Ntk_t *, int, word, Vec_Int_t *)");
  }
  if ((p->vObjFans).nSize <= Pivot) goto LAB_003b3055;
  iVar11 = (p->vObjFans).pArray[(uint)Pivot];
  lVar15 = (long)iVar11;
  if ((lVar15 < 0) || ((p->vFanSto).nSize <= iVar11)) goto LAB_003b3036;
  piVar4 = (p->vFanSto).pArray;
  if (0 < piVar4[lVar15]) {
    lVar6 = 0;
    do {
      lVar10 = lVar6 + 1;
      lVar6 = lVar6 + 1;
      Vec_IntPush(p_00,piVar4[lVar15 + lVar10]);
    } while (lVar6 < piVar4[lVar15]);
  }
  if ((p->vObjTruth).nSize <= Pivot) {
    uVar9 = Pivot + 1;
    iVar11 = (p->vObjTruth).nCap;
    uVar13 = iVar11 * 2;
    if (Pivot < (int)uVar13) {
      if (iVar11 < (int)uVar13 && iVar11 <= Pivot) {
        pwVar5 = (p->vObjTruth).pArray;
        if (pwVar5 == (word *)0x0) {
          pwVar5 = (word *)malloc((long)iVar11 << 4);
        }
        else {
          pwVar5 = (word *)realloc(pwVar5,(long)iVar11 << 4);
        }
        (p->vObjTruth).pArray = pwVar5;
LAB_003b2c6a:
        if (pwVar5 == (word *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
        }
        (p->vObjTruth).nCap = uVar13;
      }
    }
    else if (iVar11 <= Pivot) {
      pwVar5 = (p->vObjTruth).pArray;
      if (pwVar5 == (word *)0x0) {
        pwVar5 = (word *)malloc((ulong)uVar9 << 3);
      }
      else {
        pwVar5 = (word *)realloc(pwVar5,(ulong)uVar9 << 3);
      }
      (p->vObjTruth).pArray = pwVar5;
      uVar13 = uVar9;
      goto LAB_003b2c6a;
    }
    iVar11 = (p->vObjTruth).nSize;
    if (iVar11 <= Pivot) {
      memset((p->vObjTruth).pArray + iVar11,0,(ulong)(uint)(Pivot - iVar11) * 8 + 8);
    }
    (p->vObjTruth).nSize = uVar9;
  }
  if ((p->vObjTruth).nSize <= Pivot) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                  ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
  }
  (p->vObjTruth).pArray[(uint)Pivot] = uTruth;
  if ((p->vCnfs).nSize <= Pivot) goto LAB_003b2f7c;
  pVVar7 = (p->vCnfs).pArray;
  piVar4 = pVVar7[(uint)Pivot].pArray;
  pVVar7 = pVVar7 + (uint)Pivot;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
    pVVar7->pArray = (int *)0x0;
  }
  pVVar7->nCap = 0;
  pVVar7->nSize = 0;
  if (Pivot < (p->vObjFans).nSize) {
    piVar4 = (p->vObjFans).pArray;
    iVar11 = piVar4[(uint)Pivot];
    lVar15 = (long)iVar11;
    if ((-1 < lVar15) && (iVar11 < (p->vFanSto).nSize)) {
      piVar1 = (p->vFanSto).pArray;
      if (0 < piVar1[lVar15]) {
        lVar6 = 0;
        do {
          iVar11 = (piVar1 + lVar15)[lVar6 + 1];
          lVar10 = (long)iVar11;
          if ((lVar10 < 0) || ((p->vFanouts).nSize <= iVar11)) goto LAB_003b2f7c;
          pVVar7 = (p->vFanouts).pArray;
          uVar9 = pVVar7[lVar10].nSize;
          uVar12 = 0;
          bVar16 = 0 < (int)uVar9;
          if (0 < (int)uVar9) {
            bVar16 = true;
            if (*pVVar7[lVar10].pArray != Pivot) {
              uVar8 = 0;
              do {
                if ((ulong)uVar9 - 1 == uVar8) {
                  bVar16 = false;
                  uVar12 = (ulong)uVar9;
                  goto LAB_003b2dc1;
                }
                uVar12 = uVar8 + 1;
                lVar3 = uVar8 + 1;
                uVar8 = uVar12;
              } while (pVVar7[lVar10].pArray[lVar3] != Pivot);
              bVar16 = uVar12 < uVar9;
            }
          }
LAB_003b2dc1:
          if ((uint)uVar12 == uVar9) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                          ,0x223,"void Acb_ObjRemoveFaninFanout(Acb_Ntk_t *, int)");
          }
          if (!bVar16) {
            __assert_fail("i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
          }
          uVar13 = (uint)uVar12 + 1;
          if ((int)uVar13 < (int)uVar9) {
            piVar2 = pVVar7[lVar10].pArray;
            piVar14 = piVar2 + uVar13;
            do {
              iVar11 = (int)uVar12;
              piVar2[uVar12 & 0xffffffff] = *piVar14;
              uVar9 = pVVar7[lVar10].nSize;
              piVar14 = piVar14 + 1;
              uVar12 = (ulong)(iVar11 + 1);
            } while (iVar11 + 2 < (int)uVar9);
          }
          lVar6 = lVar6 + 1;
          pVVar7[lVar10].nSize = uVar9 - 1;
        } while (lVar6 < piVar1[lVar15]);
      }
      if ((p->vObjFans).nSize <= Pivot) goto LAB_003b3055;
      iVar11 = piVar4[(uint)Pivot];
      lVar15 = (long)iVar11;
      if ((-1 < lVar15) && (iVar11 < (p->vFanSto).nSize)) {
        if (0 < piVar1[lVar15]) {
          lVar6 = 0;
          do {
            if (piVar1[lVar15 + lVar6 + 1] < 1) {
              __assert_fail("pFanins[i] > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                            ,0x1c8,"void Acb_ObjRemoveFanins(Acb_Ntk_t *, int)");
            }
            piVar1[lVar15 + lVar6 + 1] = -1;
            lVar6 = lVar6 + 1;
          } while (lVar6 < piVar1[lVar15]);
        }
        piVar1[lVar15] = 0;
        iVar11 = (p->vFanouts).nSize;
        if (vSupp == (Vec_Int_t *)0x0) {
          if (Pivot < iVar11) {
            if ((p->vFanouts).pArray[(uint)Pivot].nSize == 0) {
              if ((p->vObjType).nSize <= Pivot) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                              ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
              }
              (p->vObjType).pArray[(uint)Pivot] = '\0';
            }
            goto LAB_003b2eea;
          }
        }
        else if (Pivot < iVar11) {
          if ((p->vFanouts).pArray[(uint)Pivot].nSize < 1) {
            __assert_fail("Acb_ObjFanoutNum(p, Pivot) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                          ,0x296,"void Acb_NtkResetNode(Acb_Ntk_t *, int, word, Vec_Int_t *)");
          }
          Acb_ObjAddFanins(p,Pivot,vSupp);
          Acb_ObjAddFaninFanout(p,Pivot);
LAB_003b2eea:
          iVar11 = p_00->nSize;
          if (0 < (long)iVar11) {
            piVar4 = p_00->pArray;
            lVar15 = 0;
            do {
              Pivot_00 = piVar4[lVar15];
              lVar6 = (long)Pivot_00;
              if (lVar6 < 1) goto LAB_003b2f9b;
              if ((p->vObjType).nSize <= Pivot_00) goto LAB_003b2fba;
              if ((byte)((p->vObjType).pArray[lVar6] - 5U) < 0xfe) {
                if ((p->vFanouts).nSize <= Pivot_00) goto LAB_003b2f7c;
                if ((p->vFanouts).pArray[lVar6].nSize == 0) {
                  Acb_NtkResetNode(p,Pivot_00,0,(Vec_Int_t *)0x0);
                }
              }
              lVar15 = lVar15 + 1;
            } while (iVar11 != lVar15);
          }
          if (p_00->pArray != (int *)0x0) {
            free(p_00->pArray);
            p_00->pArray = (int *)0x0;
          }
          free(p_00);
          return;
        }
LAB_003b2f7c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
    }
LAB_003b3036:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
LAB_003b3055:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Acb_NtkResetNode( Acb_Ntk_t * p, int Pivot, word uTruth, Vec_Int_t * vSupp )
{
    // remember old fanins
    int k, iFanin, * pFanins; 
    Vec_Int_t * vFanins = Vec_IntAlloc( 6 );
    assert( !Acb_ObjIsCio(p, Pivot) );
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
        Vec_IntPush( vFanins, iFanin );
    // update function
    Vec_WrdSetEntry( &p->vObjTruth, Pivot, uTruth );
    Vec_IntErase( Vec_WecEntry(&p->vCnfs, Pivot) );
    // remove old fanins
    Acb_ObjRemoveFaninFanout( p, Pivot );
    Acb_ObjRemoveFanins( p, Pivot );
    // add new fanins
    if ( vSupp != NULL )
    {
        assert( Acb_ObjFanoutNum(p, Pivot) > 0 );
        Acb_ObjAddFanins( p, Pivot, vSupp );
        Acb_ObjAddFaninFanout( p, Pivot );
    }
    else if ( Acb_ObjFanoutNum(p, Pivot) == 0 )
        Acb_ObjCleanType( p, Pivot );
    // delete dangling fanins
    Vec_IntForEachEntry( vFanins, iFanin, k )
        if ( !Acb_ObjIsCio(p, iFanin) && Acb_ObjFanoutNum(p, iFanin) == 0 )
            Acb_NtkResetNode( p, iFanin, 0, NULL );
    Vec_IntFree( vFanins );
}